

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>
wasm::Builder::makeExport(Name name,Name value,ExternalKind kind)

{
  pointer pEVar1;
  __uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> this;
  undefined4 in_register_00000084;
  ExternalKind in_R9D;
  undefined1 auStack_30 [4];
  ExternalKind kind_local;
  Name value_local;
  Name name_local;
  __single_object *export_;
  
  _auStack_30 = value.super_IString.str._M_str;
  value_local.super_IString.str._M_str = name.super_IString.str._M_str;
  this.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl = name.super_IString.str._M_len;
  value_local.super_IString.str._M_len = CONCAT44(in_register_00000084,kind);
  std::make_unique<wasm::Export>();
  pEVar1 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                     ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                      this.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
  Name::operator=(&pEVar1->name,(Name *)&value_local.super_IString.str._M_str);
  pEVar1 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                     ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                      this.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
  Name::operator=(&pEVar1->value,(Name *)auStack_30);
  pEVar1 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                     ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                      this.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
  pEVar1->kind = in_R9D;
  return (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
         (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
         this.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<Export>
  makeExport(Name name, Name value, ExternalKind kind) {
    auto export_ = std::make_unique<Export>();
    export_->name = name;
    export_->value = value;
    export_->kind = kind;
    return export_;
  }